

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDF * __thiscall QPDFObjectHandle::getQPDF(QPDFObjectHandle *this,string *error_msg)

{
  bool bVar1;
  element_type *this_00;
  runtime_error *this_01;
  ulong uVar2;
  QPDF *local_68;
  allocator<char> local_41;
  string local_40 [32];
  QPDF *local_20;
  QPDF *result;
  string *error_msg_local;
  QPDFObjectHandle *this_local;
  
  result = (QPDF *)error_msg;
  error_msg_local = (string *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_68 = QPDFObject::getQPDF(this_00);
  }
  else {
    local_68 = (QPDF *)0x0;
  }
  local_20 = local_68;
  if (local_68 != (QPDF *)0x0) {
    return local_68;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_40,(string *)result);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"attempt to use a null qpdf object",&local_41);
  }
  std::runtime_error::runtime_error(this_01,local_40);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

QPDF&
QPDFObjectHandle::getQPDF(std::string const& error_msg) const
{
    if (auto result = obj ? obj->getQPDF() : nullptr) {
        return *result;
    }
    throw std::runtime_error(error_msg.empty() ? "attempt to use a null qpdf object" : error_msg);
}